

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

string * __thiscall
cmPolicies::GetRequiredPolicyError_abi_cxx11_
          (string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  ostream *poVar1;
  char *pcVar2;
  PolicyID id_00;
  ostringstream local_190 [8];
  ostringstream error;
  PolicyID id_local;
  
  id_00 = (PolicyID)this;
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"Policy ");
  pcVar2 = idToString(id_00);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1," is not set to NEW: ");
  pcVar2 = idToShortDescription(id_00);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"  Run \"cmake --help-policy ");
  pcVar2 = idToString(id_00);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,
                           "\" for policy details.  CMake now requires this policy to be set to NEW by the project.  The policy may be set explicitly using the code\n  cmake_policy(SET "
                          );
  pcVar2 = idToString(id_00);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,
                           " NEW)\nor by upgrading all policies with the code\n  cmake_policy(VERSION "
                          );
  pcVar2 = idToVersion(id_00);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,
                  ") # or later\nRun \"cmake --help-command cmake_policy\" for more information.");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetRequiredPolicyError(cmPolicies::PolicyID id)
{
  std::ostringstream error;
  error <<
    "Policy " << idToString(id) << " is not set to NEW: "
    "" << idToShortDescription(id) << "  "
    "Run \"cmake --help-policy " << idToString(id) << "\" for "
    "policy details.  "
    "CMake now requires this policy to be set to NEW by the project.  "
    "The policy may be set explicitly using the code\n"
    "  cmake_policy(SET " << idToString(id) << " NEW)\n"
    "or by upgrading all policies with the code\n"
    "  cmake_policy(VERSION " << idToVersion(id) <<
    ") # or later\n"
    "Run \"cmake --help-command cmake_policy\" for more information.";
  return error.str();
}